

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void MOJOSHADER_freePreshader(MOJOSHADER_preshader *preshader)

{
  void *d;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  if (preshader != (MOJOSHADER_preshader *)0x0) {
    d = preshader->malloc_data;
    UNRECOVERED_JUMPTABLE = preshader->free;
    if (UNRECOVERED_JUMPTABLE == (MOJOSHADER_free)0x0) {
      UNRECOVERED_JUMPTABLE = MOJOSHADER_internal_free;
    }
    (*UNRECOVERED_JUMPTABLE)(preshader->literals,d);
    lVar3 = 0x20;
    for (uVar1 = 0; uVar1 < preshader->instruction_count; uVar1 = uVar1 + 1) {
      uVar4 = 0;
      lVar2 = lVar3;
      while( true ) {
        if (preshader->instructions[uVar1].operand_count <= uVar4) break;
        (*UNRECOVERED_JUMPTABLE)
                  (*(void **)((long)preshader->instructions->operands + lVar2 + -0x10),d);
        uVar4 = uVar4 + 1;
        lVar2 = lVar2 + 0x18;
      }
      lVar3 = lVar3 + 0x70;
    }
    (*UNRECOVERED_JUMPTABLE)(preshader->instructions,d);
    (*UNRECOVERED_JUMPTABLE)(preshader->registers,d);
    free_symbols(UNRECOVERED_JUMPTABLE,d,preshader->symbols,preshader->symbol_count);
    (*UNRECOVERED_JUMPTABLE)(preshader,d);
    return;
  }
  return;
}

Assistant:

void MOJOSHADER_freePreshader(const MOJOSHADER_preshader *preshader)
{
    if (preshader != NULL)
    {
        unsigned int i, j;
        void *d = preshader->malloc_data;
        MOJOSHADER_free f = preshader->free;
        if (f == NULL) f = MOJOSHADER_internal_free;

        f((void *) preshader->literals, d);
        for (i = 0; i < preshader->instruction_count; i++)
        {
            for (j = 0; j < preshader->instructions[i].operand_count; j++)
                f((void *) preshader->instructions[i].operands[j].array_registers, d);
        } // for
        f((void *) preshader->instructions, d);
        f((void *) preshader->registers, d);
        free_symbols(f, d, preshader->symbols, preshader->symbol_count);
        f((void *) preshader, d);
    } // if
}